

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtCentroidCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  char *pcVar1;
  ostringstream buf;
  ContextType local_1ac;
  string local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  if (*(int *)((long)this + 0x128) == 1) {
    pcVar1 = 
    "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}in highp vec3[2] v_barycentrics;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.0005;\n\n\thighp vec3 centroidInterpolated = interpolateAtCentroid(v_barycentrics[1]);\n\tbool centroidIsInvalid = any(greaterThan(centroidInterpolated, vec3(1.0))) ||\n\t                         any(lessThan(centroidInterpolated, vec3(0.0)));\n\n\tif (!centroidIsInvalid)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
    ;
  }
  else {
    if (*(int *)((long)this + 0x128) != 0) goto LAB_0043b728;
    pcVar1 = 
    "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}in highp vec3 v_barycentricsA;\ncentroid in highp vec3 v_barycentricsB;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.0005;\n\n\thighp vec3 centroidASampled = interpolateAtCentroid(v_barycentricsA);\n\tbool valuesEqual = all(lessThan(abs(centroidASampled - v_barycentricsB), vec3(threshold)));\n\tbool centroidAIsInvalid = any(greaterThan(centroidASampled, vec3(1.0))) ||\n\t                          any(lessThan(centroidASampled, vec3(0.0)));\n\tbool centroidBIsInvalid = any(greaterThan(v_barycentricsB, vec3(1.0))) ||\n\t                          any(lessThan(v_barycentricsB, vec3(0.0)));\n\n\tif (valuesEqual && !centroidAIsInvalid && !centroidBIsInvalid)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse if (centroidAIsInvalid || centroidBIsInvalid)\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 1.0, 0.0, 1.0);\n}\n"
    ;
  }
  std::operator<<((ostream *)local_188,pcVar1);
LAB_0043b728:
  std::__cxx11::stringbuf::str();
  local_1ac.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1a8,&local_1ac);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtCentroidCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	if (m_type == TEST_CONSISTENCY)
		buf <<	"${GLSL_VERSION_DECL}\n"
				"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
				"in highp vec3 v_barycentricsA;\n"
				"centroid in highp vec3 v_barycentricsB;\n"
				"layout(location = 0) out highp vec4 fragColor;\n"
				"void main (void)\n"
				"{\n"
				"	const highp float threshold = 0.0005;\n"
				"\n"
				"	highp vec3 centroidASampled = interpolateAtCentroid(v_barycentricsA);\n"
				"	bool valuesEqual = all(lessThan(abs(centroidASampled - v_barycentricsB), vec3(threshold)));\n"
				"	bool centroidAIsInvalid = any(greaterThan(centroidASampled, vec3(1.0))) ||\n"
				"	                          any(lessThan(centroidASampled, vec3(0.0)));\n"
				"	bool centroidBIsInvalid = any(greaterThan(v_barycentricsB, vec3(1.0))) ||\n"
				"	                          any(lessThan(v_barycentricsB, vec3(0.0)));\n"
				"\n"
				"	if (valuesEqual && !centroidAIsInvalid && !centroidBIsInvalid)\n"
				"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
				"	else if (centroidAIsInvalid || centroidBIsInvalid)\n"
				"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"	else\n"
				"		fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n"
				"}\n";
	else if (m_type == TEST_ARRAY_ELEMENT)
		buf <<	"${GLSL_VERSION_DECL}\n"
				"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
				"in highp vec3[2] v_barycentrics;\n"
				"layout(location = 0) out mediump vec4 fragColor;\n"
				"void main (void)\n"
				"{\n"
				"	const highp float threshold = 0.0005;\n"
				"\n"
				"	highp vec3 centroidInterpolated = interpolateAtCentroid(v_barycentrics[1]);\n"
				"	bool centroidIsInvalid = any(greaterThan(centroidInterpolated, vec3(1.0))) ||\n"
				"	                         any(lessThan(centroidInterpolated, vec3(0.0)));\n"
				"\n"
				"	if (!centroidIsInvalid)\n"
				"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
				"	else\n"
				"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"}\n";
	else
		DE_ASSERT(false);

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}